

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall embree::SceneGraph::PlyParser::import(PlyParser *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  pointer pvVar5;
  undefined8 uVar6;
  TriangleMeshNode *pTVar7;
  PlyParser *pPVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
  *this_01;
  OBJMaterial *this_02;
  TriangleMeshNode *pTVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  Vec3fa *pVVar12;
  long lVar13;
  mapped_type *pmVar14;
  undefined4 *puVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  pointer puVar18;
  undefined8 uVar19;
  size_t k;
  ulong uVar20;
  ulong uVar21;
  long in_RSI;
  allocator local_a9;
  key_type local_a8;
  mapped_type *local_88;
  TriangleMeshNode *local_80;
  mapped_type *local_78;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  OBJMaterial *local_68;
  PlyParser *local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
  *local_58;
  string local_50;
  
  this_02 = (OBJMaterial *)MaterialNode::operator_new(0x180);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_a8);
  OBJMaterial::OBJMaterial(this_02,&local_50);
  (*(this_02->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_02);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar9 = (TriangleMeshNode *)::operator_new(0xd8);
  local_70.ptr = (MaterialNode *)this_02;
  (*(this_02->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_02);
  TriangleMeshNode::TriangleMeshNode(pTVar9,&local_70,(BBox1f)0x3f80000000000000,1);
  (*(pTVar9->super_Node).super_RefCount._vptr_RefCount[2])(pTVar9);
  if ((OBJMaterial *)local_70.ptr != (OBJMaterial *)0x0) {
    (*(((Node *)&((local_70.ptr)->super_Node).super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  local_80 = pTVar9;
  local_68 = this_02;
  std::__cxx11::string::string((string *)&local_a8,"vertex",&local_a9);
  local_88 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
                   *)(in_RSI + 0x228),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"x",&local_a9);
  this_00 = &local_88->data;
  local_78 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::at(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"y",&local_a9);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::at(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"z",&local_a9);
  local_60 = this;
  local_58 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
              *)(in_RSI + 0x228);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::at(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  pvVar4 = (pTVar9->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = local_88->size;
  uVar16 = pvVar4->size_alloced;
  uVar21 = uVar16;
  if ((uVar16 < uVar17) && (uVar20 = uVar16, uVar21 = uVar17, uVar16 != 0)) {
    for (; uVar21 = uVar20, uVar20 < uVar17; uVar20 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0)) {
    }
  }
  if (uVar17 < pvVar4->size_active) {
    pvVar4->size_active = uVar17;
  }
  if (uVar16 == uVar21) {
    pvVar4->size_active = uVar17;
  }
  else {
    ptr = pvVar4->items;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
    pvVar4->items = pVVar12;
    lVar13 = 0;
    for (uVar16 = 0; uVar16 < pvVar4->size_active; uVar16 = uVar16 + 1) {
      puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar13);
      uVar19 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar19;
      lVar13 = lVar13 + 0x10;
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar17;
    pvVar4->size_alloced = uVar21;
  }
  this_01 = local_58;
  pTVar9 = local_80;
  lVar13 = 0;
  for (uVar17 = 0; uVar17 < local_88->size; uVar17 = uVar17 + 1) {
    (((local_80->positions).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->items->field_0).m128[lVar13] =
         *(float *)((long)(local_78->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar13);
    *(undefined4 *)
     ((long)&((local_80->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar13 * 4 + 4) =
         *(undefined4 *)
          ((long)(pmVar10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar13);
    *(undefined4 *)
     ((long)&((local_80->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar13 * 4 + 8) =
         *(undefined4 *)
          ((long)(pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar13);
    lVar13 = lVar13 + 4;
  }
  std::__cxx11::string::string((string *)&local_a8,"face",&local_a9);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
            ::at(this_01,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"vertex_indices",&local_a9);
  local_78 = (mapped_type *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
             ::at(&pmVar14->list,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  pmVar14 = (mapped_type *)0x0;
  while( true ) {
    pPVar8 = local_60;
    pTVar7 = local_80;
    pvVar5 = (((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&local_78->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
             super__Vector_impl_data._M_start;
    lVar13 = (long)(((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)&local_78->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                   super__Vector_impl_data._M_finish - (long)pvVar5;
    if ((mapped_type *)(lVar13 / 0x18) <= pmVar14) break;
    puVar15 = *(undefined4 **)
               &pvVar5[(long)pmVar14].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data;
    puVar18 = pvVar5[(long)pmVar14].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_88 = pmVar14;
    if (0x10 < (ulong)((long)puVar18 - (long)puVar15)) {
      uVar3 = *puVar15;
      uVar19 = *(undefined8 *)(puVar15 + 2);
      for (uVar17 = 2; uVar17 < (ulong)((long)puVar18 - (long)puVar15 >> 3); uVar17 = uVar17 + 1) {
        uVar6 = *(undefined8 *)(puVar15 + uVar17 * 2);
        local_a8._M_dataplus._M_p._4_4_ = (undefined4)uVar19;
        local_a8._M_string_length._0_4_ = (undefined4)uVar6;
        local_a8._M_dataplus._M_p._0_4_ = uVar3;
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (&pTVar9->triangles,(Triangle *)&local_a8);
        puVar15 = *(undefined4 **)
                   &pvVar5[(long)pmVar14].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data;
        puVar18 = pvVar5[(long)pmVar14].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar19 = uVar6;
      }
    }
    pmVar14 = (mapped_type *)((long)&(local_88->name)._M_dataplus._M_p + 1);
  }
  *(TriangleMeshNode **)local_60 = local_80;
  (*(local_80->super_Node).super_RefCount._vptr_RefCount[2])(local_80,0x18,lVar13 % 0x18);
  (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[3])(pTVar7);
  (*(local_68->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
  return (Ref<embree::SceneGraph::Node>)(Node *)pPVar8;
}

Assistant:

Ref<SceneGraph::Node> import()
      {
        Ref<SceneGraph::MaterialNode> material = new OBJMaterial;
        Ref<SceneGraph::TriangleMeshNode> mesh_o = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
        
        /* convert all vertices */
        const Element& vertices = mesh.elements.at("vertex");
        const std::vector<float>& posx = vertices.data.at("x");
        const std::vector<float>& posy = vertices.data.at("y");
        const std::vector<float>& posz = vertices.data.at("z");
        
        mesh_o->positions[0].resize(vertices.size);
        for (size_t i=0; i<vertices.size; i++) {
          mesh_o->positions[0][i].x = posx[i];
          mesh_o->positions[0][i].y = posy[i];
          mesh_o->positions[0][i].z = posz[i];
        }

        /* convert all faces */
        const Element& faces = mesh.elements.at("face");
        const std::vector<std::vector<size_t> >& polygons = faces.list.at("vertex_indices");
        
        for (size_t j=0; j<polygons.size(); j++)
        {
          const std::vector<size_t>& face = polygons[j];
          if (face.size() < 3) continue;
          
          /* triangulate the face with a triangle fan */
          size_t i0 = face[0], i1 = 0, i2 = face[1];
          for (size_t k=2; k<face.size(); k++) {
            i1 = i2; i2 = face[k];
            mesh_o->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle((unsigned int)i0, (unsigned int)i1, (unsigned int)i2));
          }
        }
        return mesh_o.dynamicCast<SceneGraph::Node>();
      }